

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnswerLiteralManager.cpp
# Opt level: O3

void __thiscall
Shell::PlainALManager::recordSkolemBinding(PlainALManager *this,Term *skT,uint var,string *vName)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pair<Kernel::Term_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **pppVar2;
  pointer pcVar3;
  pair<Kernel::Term_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar4;
  size_type *local_30;
  size_type local_28;
  size_type local_20;
  undefined8 uStack_18;
  
  pcVar3 = (vName->_M_dataplus)._M_p;
  local_30 = &local_20;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_30,pcVar3,pcVar3 + vName->_M_string_length);
  ppVar4 = (this->_skolemNames)._cursor;
  if (ppVar4 == (this->_skolemNames)._end) {
    Lib::
    Stack<std::pair<Kernel::Term_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::expand(&this->_skolemNames);
    ppVar4 = (this->_skolemNames)._cursor;
  }
  ppVar4->first = skT;
  paVar1 = &(ppVar4->second).field_2;
  (ppVar4->second)._M_dataplus._M_p = (pointer)paVar1;
  if (local_30 == &local_20) {
    paVar1->_M_allocated_capacity = local_20;
    *(undefined8 *)((long)&(ppVar4->second).field_2 + 8) = uStack_18;
  }
  else {
    (ppVar4->second)._M_dataplus._M_p = (pointer)local_30;
    (ppVar4->second).field_2._M_allocated_capacity = local_20;
  }
  (ppVar4->second)._M_string_length = local_28;
  pppVar2 = &(this->_skolemNames)._cursor;
  *pppVar2 = *pppVar2 + 1;
  return;
}

Assistant:

void PlainALManager::recordSkolemBinding(Term* skT,unsigned var,std::string vName)
{
  _skolemNames.push(std::make_pair(skT,vName));
}